

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testNullModel(tst_InsertProxyModel *this)

{
  byte bVar1;
  bool bVar2;
  ModelTest *this_00;
  QList<QString> *pQVar3;
  QModelIndex local_4e0;
  QModelIndex local_4c8;
  QVariant local_4b0;
  QArrayDataPointer<char16_t> local_490;
  QString local_478;
  QVariant local_460;
  QModelIndex local_440;
  undefined1 local_428 [24];
  QModelIndex local_410;
  QModelIndex local_3f8;
  QVariant local_3e0;
  QArrayDataPointer<char16_t> local_3c0;
  QString local_3a8;
  QModelIndex local_390;
  QModelIndex local_378;
  QVariant local_360;
  QString local_340;
  QArrayDataPointer<char16_t> local_328;
  QString local_310;
  QModelIndex local_2f8;
  QModelIndex local_2e0;
  QVariant local_2c8;
  QString local_2a8;
  QArrayDataPointer<char16_t> local_290;
  QString local_278;
  QVariant local_260;
  QModelIndex local_240;
  undefined1 local_228 [24];
  QArrayDataPointer<char16_t> local_210;
  QString local_1f8;
  QList<QString> local_1e0;
  QStringListModel local_1c8 [8];
  QStringListModel validModel;
  QModelIndex local_1a0;
  QModelIndex local_188;
  QVariant local_170;
  undefined4 local_14c;
  QArrayDataPointer<char16_t> local_148;
  QString local_130;
  QVariant local_118;
  QModelIndex local_f8;
  undefined1 local_e0 [24];
  QFlags<InsertProxyModel::InsertDirection> local_c8 [4];
  InsertProxyModel local_b8 [8];
  InsertProxyModel proxyModel;
  tst_InsertProxyModel *this_local;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  
  InsertProxyModel::InsertProxyModel(local_b8,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_b8,&this->super_QObject);
  QFlags<InsertProxyModel::InsertDirection>::QFlags(local_c8,InsertRow);
  InsertProxyModel::setInsertDirection((QFlags_conflict1 *)local_b8);
  InsertProxyModel::setSourceModel((QAbstractItemModel *)local_b8);
  QModelIndex::QModelIndex(&local_f8);
  InsertProxyModel::index((int)local_e0,(int)local_b8,(QModelIndex *)0x0);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_148,(Data *)0x0,L"1",1);
  QString::QString(&local_130,&local_148);
  QVariant::QVariant(&local_118,&local_130);
  bVar1 = InsertProxyModel::setData((QModelIndex *)local_b8,(QVariant *)local_e0,(int)&local_118);
  bVar1 = QTest::qVerify((bool)(~bVar1 & 1),
                         "!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral(\"1\"))","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x1df);
  QVariant::~QVariant(&local_118);
  QString::~QString(&local_130);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    QModelIndex::QModelIndex(&local_1a0);
    InsertProxyModel::index((int)&local_188,(int)local_b8,(QModelIndex *)0x0);
    QModelIndex::data(&local_170,&local_188,0);
    bVar2 = QVariant::isValid(&local_170);
    bVar1 = QTest::qVerify((bool)(~bVar2 & 1),"!proxyModel.index(0, 0).data().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x1e0);
    QVariant::~QVariant(&local_170);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      bVar1 = InsertProxyModel::commitRow();
      bVar1 = QTest::qVerify((bool)(~bVar1 & 1),"!proxyModel.commitRow()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x1e1);
      if ((bVar1 & 1) == 0) {
        local_14c = 1;
      }
      else {
        memset(&local_1e0,0,0x18);
        QList<QString>::QList(&local_1e0);
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_210,(Data *)0x0,L"1",1);
        QString::QString(&local_1f8,&local_210);
        pQVar3 = QList<QString>::operator<<(&local_1e0,&local_1f8);
        QStringListModel::QStringListModel(local_1c8,(QList_conflict *)pQVar3,(QObject *)0x0);
        QString::~QString(&local_1f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_210);
        QList<QString>::~QList(&local_1e0);
        InsertProxyModel::setSourceModel((QAbstractItemModel *)local_b8);
        QModelIndex::QModelIndex(&local_240);
        InsertProxyModel::index((int)local_228,(int)local_b8,(QModelIndex *)0x1);
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_290,(Data *)0x0,L"2",1);
        QString::QString(&local_278,&local_290);
        QVariant::QVariant(&local_260,&local_278);
        bVar1 = InsertProxyModel::setData
                          ((QModelIndex *)local_b8,(QVariant *)local_228,(int)&local_260);
        bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                               "proxyModel.setData(proxyModel.index(1, 0), QStringLiteral(\"2\"))",
                               "",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                               ,0x1e4);
        QVariant::~QVariant(&local_260);
        QString::~QString(&local_278);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_290);
        if (((bVar1 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_2f8);
          InsertProxyModel::index((int)&local_2e0,(int)local_b8,(QModelIndex *)0x1);
          QModelIndex::data(&local_2c8,&local_2e0,0);
          QVariant::toString();
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_328,(Data *)0x0,L"2",1);
          QString::QString(&local_310,&local_328);
          bVar2 = QTest::qCompare(&local_2a8,&local_310,"proxyModel.index(1, 0).data().toString()",
                                  "QStringLiteral(\"2\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                  ,0x1e5);
          QString::~QString(&local_310);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
          QString::~QString(&local_2a8);
          QVariant::~QVariant(&local_2c8);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            bVar1 = InsertProxyModel::commitRow();
            bVar1 = QTest::qVerify((bool)(bVar1 & 1),"proxyModel.commitRow()","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x1e6);
            if ((bVar1 & 1) == 0) {
              local_14c = 1;
            }
            else {
              QModelIndex::QModelIndex(&local_390);
              QAbstractListModel::index((int)&local_378,(int)local_1c8,(QModelIndex *)0x1);
              QModelIndex::data(&local_360,&local_378,0);
              QVariant::toString();
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3c0,(Data *)0x0,L"2",1);
              QString::QString(&local_3a8,&local_3c0);
              bVar2 = QTest::qCompare(&local_340,&local_3a8,
                                      "validModel.index(1, 0).data().toString()",
                                      "QStringLiteral(\"2\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x1e7);
              QString::~QString(&local_3a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3c0);
              QString::~QString(&local_340);
              QVariant::~QVariant(&local_360);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                InsertProxyModel::setSourceModel((QAbstractItemModel *)local_b8);
                QModelIndex::QModelIndex(&local_410);
                InsertProxyModel::index((int)&local_3f8,(int)local_b8,(QModelIndex *)0x0);
                QModelIndex::data(&local_3e0,&local_3f8,0);
                bVar2 = QVariant::isValid(&local_3e0);
                bVar1 = QTest::qVerify((bool)(~bVar2 & 1),"!proxyModel.index(0, 0).data().isValid()"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x1e9);
                QVariant::~QVariant(&local_3e0);
                if (((bVar1 ^ 0xff) & 1) == 0) {
                  QModelIndex::QModelIndex(&local_440);
                  InsertProxyModel::index((int)local_428,(int)local_b8,(QModelIndex *)0x0);
                  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_490,(Data *)0x0,L"3",1);
                  QString::QString(&local_478,&local_490);
                  QVariant::QVariant(&local_460,&local_478);
                  bVar1 = InsertProxyModel::setData
                                    ((QModelIndex *)local_b8,(QVariant *)local_428,(int)&local_460);
                  bVar1 = QTest::qVerify((bool)(~bVar1 & 1),
                                         "!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral(\"3\"))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x1ea);
                  QVariant::~QVariant(&local_460);
                  QString::~QString(&local_478);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_490);
                  if (((bVar1 ^ 0xff) & 1) == 0) {
                    QModelIndex::QModelIndex(&local_4e0);
                    InsertProxyModel::index((int)&local_4c8,(int)local_b8,(QModelIndex *)0x0);
                    QModelIndex::data(&local_4b0,&local_4c8,0);
                    bVar2 = QVariant::isValid(&local_4b0);
                    bVar1 = QTest::qVerify((bool)(~bVar2 & 1),
                                           "!proxyModel.index(0, 0).data().isValid()","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                           ,0x1eb);
                    QVariant::~QVariant(&local_4b0);
                    if (((bVar1 ^ 0xff) & 1) == 0) {
                      bVar1 = InsertProxyModel::commitRow();
                      bVar1 = QTest::qVerify((bool)(~bVar1 & 1),"!proxyModel.commitRow()","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                             ,0x1ec);
                      if ((bVar1 & 1) == 0) {
                        local_14c = 1;
                      }
                      else {
                        local_14c = 0;
                      }
                    }
                    else {
                      local_14c = 1;
                    }
                  }
                  else {
                    local_14c = 1;
                  }
                }
                else {
                  local_14c = 1;
                }
              }
              else {
                local_14c = 1;
              }
            }
          }
          else {
            local_14c = 1;
          }
        }
        else {
          local_14c = 1;
        }
        QStringListModel::~QStringListModel(local_1c8);
      }
    }
    else {
      local_14c = 1;
    }
  }
  else {
    local_14c = 1;
  }
  InsertProxyModel::~InsertProxyModel(local_b8);
  return;
}

Assistant:

void tst_InsertProxyModel::testNullModel()
{
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    proxyModel.setInsertDirection(InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(nullptr);
    QVERIFY(!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral("1")));
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.commitRow());
    QStringListModel validModel(QStringList() << QStringLiteral("1"));
    proxyModel.setSourceModel(&validModel);
    QVERIFY(proxyModel.setData(proxyModel.index(1, 0), QStringLiteral("2")));
    QCOMPARE(proxyModel.index(1, 0).data().toString(), QStringLiteral("2"));
    QVERIFY(proxyModel.commitRow());
    QCOMPARE(validModel.index(1, 0).data().toString(), QStringLiteral("2"));
    proxyModel.setSourceModel(nullptr);
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral("3")));
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.commitRow());
}